

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRedcostFixing.cpp
# Opt level: O1

void __thiscall
HighsRedcostFixing::addRootRedcost
          (HighsRedcostFixing *this,HighsMipSolver *mipsolver,
          vector<double,_std::allocator<double>_> *lpredcost,double lpobjective)

{
  HighsMipSolverData *pHVar1;
  pointer pmVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  iterator iVar6;
  HighsRedcostFixing *pHVar7;
  long lVar8;
  const_iterator cVar9;
  iterator iVar10;
  iterator iVar11;
  uint uVar12;
  int iVar13;
  _Self del;
  int *piVar14;
  const_iterator cVar15;
  long lVar16;
  _Base_ptr p_Var17;
  int *piVar18;
  double dVar19;
  HighsInt lb;
  double requiredcutoffbound;
  uint local_8c;
  uint local_88;
  uint local_84;
  double local_80;
  HighsRedcostFixing *local_78;
  long local_70;
  int *local_68;
  HighsMipSolver *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *local_50;
  int local_44;
  int *local_40;
  double local_38;
  
  local_50 = &this->lurkingColLower;
  local_58 = lpredcost;
  local_38 = lpobjective;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::resize(local_50,(long)mipsolver->model_->num_col_);
  local_78 = this;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::resize(&this->lurkingColUpper,(long)mipsolver->model_->num_col_);
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  HighsLpRelaxation::computeBasicDegenerateDuals(&pHVar1->lp,pHVar1->feastol,(HighsDomain *)0x0);
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  piVar18 = *(int **)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  piVar14 = *(pointer *)
             ((long)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_> + 8);
  local_60 = mipsolver;
  local_40 = piVar14;
  if (piVar18 != piVar14) {
    do {
      pHVar7 = local_78;
      lVar16 = (long)*piVar18;
      dVar19 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar16];
      pHVar1 = (local_60->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      local_70 = lVar16;
      if (dVar19 <= pHVar1->feastol) {
        if (dVar19 < -pHVar1->feastol) {
          local_88 = (uint)*(double *)
                            (*(long *)&(pHVar1->domain).col_upper_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar16 * 8);
          if (dVar19 <= -INFINITY) {
            std::
            _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
            ::clear(&(local_78->lurkingColUpper).
                     super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t);
            std::
            _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
            ::clear(&(pHVar7->lurkingColLower).
                     super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t);
            pmVar2 = (pHVar7->lurkingColLower).
                     super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_002e4106;
          }
          dVar19 = *(double *)
                    (*(long *)&(pHVar1->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar16 * 8);
          local_8c = (int)(dVar19 + 1.5);
          if (dVar19 <= -INFINITY) {
            local_8c = local_88 - 0x400;
          }
          local_84 = (local_88 - local_8c) + 0x3ff >> 10;
          if ((int)(local_88 - local_8c) < 0x401) {
            local_84 = 1;
          }
          piVar14 = local_40;
          local_68 = piVar18;
          if ((int)local_8c <= (int)local_88) {
            do {
              lVar16 = local_70;
              pHVar1 = (local_60->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              local_80 = pHVar1->feastol;
              local_80 = ((local_80 * 10.0 + (double)(int)(~local_88 + local_8c)) *
                          (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[local_70] + local_38) - local_80;
              if (pHVar1->lower_bound <= local_80) {
                pmVar2 = (local_50->
                         super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                p_Var17 = &pmVar2[local_70]._M_t._M_impl.super__Rb_tree_header._M_header;
                cVar15._M_node = p_Var17;
                for (p_Var3 = *(_Base_ptr *)
                               ((long)&pmVar2[local_70]._M_t._M_impl.super__Rb_tree_header + 8);
                    p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar5 && bVar4]) {
                  bVar4 = local_80 != *(double *)(p_Var3 + 1);
                  bVar5 = *(double *)(p_Var3 + 1) <= local_80;
                  if (!bVar5 || !bVar4) {
                    cVar15._M_node = p_Var3;
                  }
                }
                if (cVar15._M_node != p_Var17) {
                  iVar13 = local_8c - local_84;
                  cVar9._M_node = cVar15._M_node;
                  do {
                    if (iVar13 < *(int *)&cVar9._M_node[1]._M_parent) goto LAB_002e3f0a;
                    cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar9._M_node);
                  } while (cVar9._M_node != p_Var17);
                }
                iVar10 = std::
                         _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                         ::_M_emplace_hint_equal<double&,int&>
                                   ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                     *)(pmVar2 + lVar16),cVar15,&local_80,(int *)&local_8c);
                iVar11._M_node =
                     *(_Base_ptr *)
                      ((long)&(local_50->
                              super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t._M_impl.
                              super__Rb_tree_header + 0x10);
                uVar12 = local_8c;
                while (iVar6._M_node = iVar11._M_node, local_8c = uVar12,
                      iVar6._M_node != iVar10._M_node) {
                  iVar13 = *(int *)&iVar6._M_node[1]._M_parent;
                  iVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node);
                  bVar4 = iVar13 <= (int)uVar12;
                  uVar12 = local_8c;
                  if (bVar4) {
                    std::
                    _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                    ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                        *)((local_50->
                                           super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar16),
                                       iVar6);
                    uVar12 = local_8c;
                  }
                }
              }
LAB_002e3f0a:
              local_8c = local_8c + local_84;
              piVar14 = local_40;
              piVar18 = local_68;
            } while ((int)local_8c <= (int)local_88);
          }
        }
      }
      else {
        uVar12 = (uint)*(double *)
                        (*(long *)&(pHVar1->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar16 * 8);
        local_88 = uVar12;
        if (INFINITY <= dVar19) {
          std::
          _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
          ::clear(&(local_78->lurkingColUpper).
                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t);
          std::
          _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
          ::clear(&(pHVar7->lurkingColLower).
                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t);
          pmVar2 = (pHVar7->lurkingColUpper).
                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_002e4106:
          local_80 = -INFINITY;
          std::
          _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
          ::_M_emplace_equal<double,int&>
                    ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                      *)((long)pmVar2 + lVar16 * 0x30),&local_80,(int *)&local_88);
        }
        else {
          dVar19 = *(double *)
                    (*(long *)&(pHVar1->domain).col_upper_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar16 * 8);
          if (dVar19 < INFINITY) {
            local_68 = piVar18;
            dVar19 = floor(dVar19 + -0.5);
            local_44 = (int)dVar19;
          }
          else {
            local_44 = uVar12 + 0x400;
            local_68 = piVar18;
          }
          local_84 = (local_44 - uVar12) + 0x3ff >> 10;
          if ((int)(local_44 - uVar12) < 0x401) {
            local_84 = 1;
          }
          piVar14 = local_40;
          piVar18 = local_68;
          local_8c = uVar12;
          if ((int)uVar12 <= local_44) {
            do {
              lVar8 = local_70;
              pHVar1 = (local_60->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              local_80 = (pHVar1->feastol * -10.0 + (double)(int)((uVar12 - local_88) + 1)) *
                         (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar16] + local_38;
              local_8c = uVar12;
              if (pHVar1->lower_bound <= local_80) {
                pmVar2 = (local_78->lurkingColUpper).
                         super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                p_Var17 = (_Base_ptr)((long)&pmVar2[local_70]._M_t._M_impl + 8);
                cVar15._M_node = p_Var17;
                for (p_Var3 = *(_Base_ptr *)((long)&pmVar2[local_70]._M_t._M_impl + 0x10);
                    p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar5 && bVar4]) {
                  bVar4 = local_80 != *(double *)(p_Var3 + 1);
                  bVar5 = *(double *)(p_Var3 + 1) <= local_80;
                  if (!bVar5 || !bVar4) {
                    cVar15._M_node = p_Var3;
                  }
                }
                if (cVar15._M_node != p_Var17) {
                  iVar13 = uVar12 + local_84;
                  cVar9._M_node = cVar15._M_node;
                  do {
                    if (*(int *)&cVar9._M_node[1]._M_parent < iVar13) goto LAB_002e40b5;
                    cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar9._M_node);
                  } while (cVar9._M_node != p_Var17);
                }
                iVar10 = std::
                         _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                         ::_M_emplace_hint_equal<double&,int&>
                                   ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                     *)(pmVar2 + lVar8),cVar15,&local_80,(int *)&local_8c);
                iVar11._M_node =
                     *(_Base_ptr *)
                      ((long)&(local_78->lurkingColUpper).
                              super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t._M_impl + 0x18);
                uVar12 = local_8c;
                while (iVar6._M_node = iVar11._M_node, local_8c = uVar12,
                      iVar6._M_node != iVar10._M_node) {
                  iVar13 = *(int *)&iVar6._M_node[1]._M_parent;
                  iVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node);
                  bVar4 = (int)uVar12 <= iVar13;
                  uVar12 = local_8c;
                  if (bVar4) {
                    std::
                    _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                    ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                        *)((local_78->lurkingColUpper).
                                           super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar8),iVar6)
                    ;
                    uVar12 = local_8c;
                  }
                }
              }
LAB_002e40b5:
              uVar12 = local_8c + local_84;
              piVar14 = local_40;
              lVar16 = local_70;
              piVar18 = local_68;
              local_8c = uVar12;
            } while ((int)uVar12 <= local_44);
          }
        }
      }
      piVar18 = piVar18 + 1;
    } while (piVar18 != piVar14);
  }
  return;
}

Assistant:

void HighsRedcostFixing::addRootRedcost(const HighsMipSolver& mipsolver,
                                        const std::vector<double>& lpredcost,
                                        double lpobjective) {
  lurkingColLower.resize(mipsolver.numCol());
  lurkingColUpper.resize(mipsolver.numCol());

  mipsolver.mipdata_->lp.computeBasicDegenerateDuals(
      mipsolver.mipdata_->feastol);

  for (HighsInt col : mipsolver.mipdata_->integral_cols) {
    if (lpredcost[col] > mipsolver.mipdata_->feastol) {
      // col <= (cutoffbound - lpobj)/redcost + lb
      // so for lurkub = lb to ub - 1 we can compute the necessary cutoff
      // bound to reach this bound which is:
      //  lurkub = (cutoffbound - lpobj)/redcost + lb
      //  cutoffbound = (lurkub - lb) * redcost + lpobj
      HighsInt lb = (HighsInt)mipsolver.mipdata_->domain.col_lower_[col];

      if (lpredcost[col] == kHighsInf) {
        lurkingColUpper[col].clear();
        lurkingColLower[col].clear();
        lurkingColUpper[col].emplace(-kHighsInf, lb);
        continue;
      }

      HighsInt maxub;
      if (mipsolver.mipdata_->domain.col_upper_[col] == kHighsInf)
        maxub = lb + 1024;
      else
        maxub = (HighsInt)std::floor(
            mipsolver.mipdata_->domain.col_upper_[col] - 0.5);

      HighsInt step = 1;
      if (maxub - lb > 1024) step = (maxub - lb + 1023) >> 10;

      for (HighsInt lurkub = lb; lurkub <= maxub; lurkub += step) {
        double fracbound = (lurkub - lb + 1) - 10 * mipsolver.mipdata_->feastol;
        double requiredcutoffbound = fracbound * lpredcost[col] + lpobjective;
        if (requiredcutoffbound < mipsolver.mipdata_->lower_bound) continue;
        bool useful = true;

        // check if we already have a better lurking bound stored
        auto pos = lurkingColUpper[col].lower_bound(requiredcutoffbound);
        for (auto it = pos; it != lurkingColUpper[col].end(); ++it) {
          if (it->second < lurkub + step) {
            useful = false;
            break;
          }
        }

        if (!useful) continue;

        // we have no better lurking bound stored store this lurking bound and
        // check if it dominates one that is already stored
        auto it =
            lurkingColUpper[col].emplace_hint(pos, requiredcutoffbound, lurkub);

        auto i = lurkingColUpper[col].begin();
        while (i != it) {
          if (i->second >= lurkub) {
            auto del = i++;
            lurkingColUpper[col].erase(del);
          } else {
            ++i;
          }
        }
      }
    } else if (lpredcost[col] < -mipsolver.mipdata_->feastol) {
      // col >= (cutoffbound - lpobj)/redcost + ub
      // so for lurklb = lb + 1 to ub we can compute the necessary cutoff
      // bound to reach this bound which is:
      //  lurklb = (cutoffbound - lpobj)/redcost + ub
      //  cutoffbound = (lurklb - ub) * redcost + lpobj

      HighsInt ub = (HighsInt)mipsolver.mipdata_->domain.col_upper_[col];

      if (lpredcost[col] == -kHighsInf) {
        lurkingColUpper[col].clear();
        lurkingColLower[col].clear();
        lurkingColLower[col].emplace(-kHighsInf, ub);
        continue;
      }

      HighsInt minlb;
      if (mipsolver.mipdata_->domain.col_lower_[col] == -kHighsInf)
        minlb = ub - 1024;
      else
        minlb = (HighsInt)(mipsolver.mipdata_->domain.col_lower_[col] + 1.5);

      HighsInt step = 1;
      if (ub - minlb > 1024) step = (ub - minlb + 1023) >> 10;

      for (HighsInt lurklb = minlb; lurklb <= ub; lurklb += step) {
        double fracbound = (lurklb - ub - 1) + 10 * mipsolver.mipdata_->feastol;
        double requiredcutoffbound = fracbound * lpredcost[col] + lpobjective -
                                     mipsolver.mipdata_->feastol;
        if (requiredcutoffbound < mipsolver.mipdata_->lower_bound) continue;
        bool useful = true;

        // check if we already have a better lurking bound stored
        auto pos = lurkingColLower[col].lower_bound(requiredcutoffbound);
        for (auto it = pos; it != lurkingColLower[col].end(); ++it) {
          if (it->second > lurklb - step) {
            useful = false;
            break;
          }
        }

        if (!useful) continue;

        // we have no better lurking bound stored store this lurking bound and
        // check if it dominates one that is already stored
        auto it =
            lurkingColLower[col].emplace_hint(pos, requiredcutoffbound, lurklb);

        auto i = lurkingColLower[col].begin();
        while (i != it) {
          if (i->second <= lurklb) {
            auto del = i++;
            lurkingColLower[col].erase(del);
          } else {
            ++i;
          }
        }
      }
    }
  }
}